

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O1

void __thiscall blcl::net::connection<MsgType>::write_body(connection<MsgType> *this)

{
  pointer puVar1;
  message<MsgType> *pmVar2;
  transfer_all_t local_41;
  anon_class_8_1_8991fb9c_for_handler_ local_40;
  socket *local_38;
  const_buffers_1 local_30;
  
  pmVar2 = tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  puVar1 = (pmVar2->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar2 = tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  local_30.super_const_buffer.size_ =
       (long)(pmVar2->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(pmVar2->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_40.this = this;
  local_38 = &this->socket_;
  local_30.super_const_buffer.data_ = puVar1;
  asio::detail::
  initiate_async_write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
  ::operator()((initiate_async_write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
                *)&local_38,&local_40,&local_30,&local_41);
  return;
}

Assistant:

void write_body() {
            asio::async_write(socket_, asio::buffer(outgoing_messages_.front().body.data(), outgoing_messages_.front().body.size()),
                [this](asio::error_code ec, std::size_t length) {
                    if (!ec) {
                        outgoing_messages_.pop_front();
                        if (!outgoing_messages_.empty())
                            write_header();
                    } else {
                        std::cout << "[WARN] " << id_ << ": Write body failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }